

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonutils.cpp
# Opt level: O2

ComponentPtr owningComponent(ParentedEntityConstPtr *entity)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentPtr CVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  libcellml::ParentedEntity::parent();
  std::dynamic_pointer_cast<libcellml::Component,libcellml::ParentedEntity>
            ((shared_ptr<libcellml::ParentedEntity> *)entity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entity;
  return (ComponentPtr)CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ComponentPtr owningComponent(const libcellml::ParentedEntityConstPtr &entity)
{
    return std::dynamic_pointer_cast<libcellml::Component>(entity->parent());
}